

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_uv.cc
# Opt level: O0

int UVScale(uint8_t *src_uv,int src_stride_uv,int src_width,int src_height,uint8_t *dst_uv,
           int dst_stride_uv,int dst_width,int dst_height,FilterMode filtering)

{
  int in_ECX;
  int in_EDX;
  undefined8 unaff_RBX;
  int in_ESI;
  uint8_t *in_RDI;
  long in_R8;
  uint8_t *unaff_R14;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000020;
  int in_stack_00000028;
  int in_stack_00000030;
  int in_stack_00000038;
  int in_stack_00000040;
  FilterMode in_stack_00000050;
  int in_stack_ffffffffffffffe4;
  int iVar1;
  
  if (((((in_RDI == (uint8_t *)0x0) || (in_EDX == 0)) || (in_ECX == 0)) ||
      ((0x8000 < in_EDX || (0x8000 < in_ECX)))) ||
     ((in_R8 == 0 || ((in_stack_00000008 < 1 || (in_stack_00000010 < 1)))))) {
    iVar1 = -1;
  }
  else {
    libyuv::ScaleUV(unaff_R14,(int)((ulong)unaff_RBX >> 0x20),(int)unaff_RBX,
                    in_stack_ffffffffffffffe4,in_RDI,in_ESI,in_stack_00000020,in_stack_00000028,
                    in_stack_00000030,in_stack_00000038,in_stack_00000040,(int)dst_uv,
                    in_stack_00000050);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

LIBYUV_API
int UVScale(const uint8_t* src_uv,
            int src_stride_uv,
            int src_width,
            int src_height,
            uint8_t* dst_uv,
            int dst_stride_uv,
            int dst_width,
            int dst_height,
            enum FilterMode filtering) {
  if (!src_uv || src_width == 0 || src_height == 0 || src_width > 32768 ||
      src_height > 32768 || !dst_uv || dst_width <= 0 || dst_height <= 0) {
    return -1;
  }
  ScaleUV(src_uv, src_stride_uv, src_width, src_height, dst_uv, dst_stride_uv,
          dst_width, dst_height, 0, 0, dst_width, dst_height, filtering);
  return 0;
}